

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScFltArray(Lowerer *this,Instr *arrInstr)

{
  ProfileId index;
  Instr *pIVar1;
  bool bVar2;
  intptr_t weakFuncRef;
  JitProfilingInstr *pJVar3;
  JITTimeProfileInfo *pJVar4;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  AddrOpnd *pAVar5;
  Opnd *opndArg;
  JnHelperMethod helperMethod;
  
  pIVar1 = arrInstr->m_prev;
  helperMethod = HelperScrArr_OP_NewScFltArray;
  if ((arrInstr->m_kind == InstrKindJitProfiling) || (arrInstr->m_kind == InstrKindProfiled)) {
    bVar2 = Func::HasProfileInfo(arrInstr->m_func);
    if (bVar2) {
      weakFuncRef = Func::GetWeakFuncRef(arrInstr->m_func);
      if (weakFuncRef != 0) {
        if (arrInstr->m_kind == InstrKindJitProfiling) {
          pJVar3 = IR::Instr::AsJitProfilingInstr(arrInstr);
        }
        else {
          pJVar3 = (JitProfilingInstr *)IR::Instr::AsProfiledInstr(arrInstr);
        }
        index = pJVar3->profileId;
        pJVar4 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
        arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar4,index);
        pJVar4 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
        arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar4,index);
        if (arrInstr->m_kind == InstrKindProfiled) {
          GenerateProfiledNewScFloatArrayFastPath(this,arrInstr,arrayInfo,arrayInfoAddr,weakFuncRef)
          ;
        }
        pAVar5 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar5->super_Opnd);
        pAVar5 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar5->super_Opnd);
        helperMethod = HelperScrArr_ProfiledNewScFltArray;
      }
    }
  }
  LoadScriptContext(this,arrInstr);
  opndArg = IR::Instr::UnlinkSrc1(arrInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,opndArg);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,arrInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScFltArray(IR::Instr *arrInstr)
{
    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScFltArray;

    if ((arrInstr->IsJitProfilingInstr() || arrInstr->IsProfiledInstr()) && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        if (weakFuncRef)
        {
            Js::ProfileId profileId =
                arrInstr->IsJitProfilingInstr()
                    ? arrInstr->AsJitProfilingInstr()->profileId
                    : static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);

            Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
            intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

            // Only do fast-path if it isn't a JitProfiling instr
            if (arrInstr->IsProfiledInstr()) {
                GenerateProfiledNewScFloatArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef);
            }

            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScFltArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *elementsOpnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, elementsOpnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}